

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

_Bool upb_Arena_Fuse(upb_Arena *a1,upb_Arena *a2)

{
  uintptr_t *puVar1;
  upb_ArenaInternal **ppuVar2;
  upb_ArenaInternal *puVar3;
  upb_ArenaRoot uVar4;
  upb_ArenaInternal *puVar5;
  upb_ArenaInternal *puVar6;
  uintptr_t uVar7;
  _Bool _Var8;
  long lVar9;
  ulong uVar10;
  upb_ArenaInternal *puVar11;
  bool bVar12;
  upb_ArenaRoot uVar13;
  upb_ArenaRoot uVar14;
  
  _Var8 = true;
  if (a1 != a2) {
    if ((((ulong)a1[1].ptr_dont_copy_me__upb_internal_use_only & 1) == 0) &&
       (((ulong)a2[1].ptr_dont_copy_me__upb_internal_use_only & 1) == 0)) {
      lVar9 = 0;
LAB_00111ff4:
      do {
        uVar13 = _upb_Arena_FindRoot(a1);
        puVar5 = uVar13.root;
        uVar14 = _upb_Arena_FindRoot(a2);
        if (puVar5 == uVar14.root) {
          if (puVar5 == (upb_ArenaInternal *)0x0) goto LAB_00111ff4;
        }
        else {
          uVar4 = uVar14;
          if (uVar14.root < puVar5) {
            uVar4 = uVar13;
            uVar13 = uVar14;
          }
          uVar7 = uVar13.tagged_count;
          puVar5 = uVar13.root;
          uVar10 = uVar4.tagged_count;
          LOCK();
          bVar12 = uVar7 == puVar5->parent_or_count;
          if (bVar12) {
            puVar5->parent_or_count = uVar7 + (uVar10 & 0xfffffffffffffffe);
          }
          UNLOCK();
          if (!bVar12) goto LAB_00111ff4;
          if (((undefined1  [16])uVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            __assert_fail("_upb_Arena_IsTaggedPointer(parent_or_count)",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/mem/arena.c"
                          ,0x6e,"uintptr_t _upb_Arena_TaggedFromPointer(upb_ArenaInternal *)");
          }
          puVar1 = &(uVar4.root)->parent_or_count;
          LOCK();
          bVar12 = uVar10 == *puVar1;
          if (bVar12) {
            *puVar1 = (uintptr_t)puVar5;
          }
          UNLOCK();
          if (!bVar12) {
            lVar9 = lVar9 + (uVar10 & 0xfffffffffffffffe);
            goto LAB_00111ff4;
          }
          puVar3 = puVar5->tail;
          puVar11 = uVar4.root;
          do {
            do {
              puVar6 = puVar3;
              puVar3 = puVar6->next;
            } while (puVar3 != (upb_ArenaInternal *)0x0);
            LOCK();
            ppuVar2 = &puVar6->next;
            puVar6 = *ppuVar2;
            *ppuVar2 = puVar11;
            UNLOCK();
            ppuVar2 = &puVar11->tail;
            puVar3 = *ppuVar2;
            puVar11 = puVar6;
          } while (puVar6 != (upb_ArenaInternal *)0x0);
          puVar5->tail = *ppuVar2;
        }
        if (lVar9 == 0) {
          return true;
        }
        uVar10 = puVar5->parent_or_count;
        if ((uVar10 & 1) == 0) goto LAB_00111ff4;
        LOCK();
        bVar12 = uVar10 == puVar5->parent_or_count;
        if (bVar12) {
          puVar5->parent_or_count = uVar10 - lVar9;
        }
        UNLOCK();
      } while (!bVar12);
    }
    else {
      _Var8 = false;
    }
  }
  return _Var8;
}

Assistant:

bool upb_Arena_Fuse(upb_Arena* a1, upb_Arena* a2) {
  if (a1 == a2) return true;  // trivial fuse

#ifdef UPB_TRACING_ENABLED
  upb_Arena_LogFuse(a1, a2);
#endif

  upb_ArenaInternal* ai1 = upb_Arena_Internal(a1);
  upb_ArenaInternal* ai2 = upb_Arena_Internal(a2);

  // Do not fuse initial blocks since we cannot lifetime extend them.
  // Any other fuse scenario is allowed.
  if (_upb_ArenaInternal_HasInitialBlock(ai1) ||
      _upb_ArenaInternal_HasInitialBlock(ai2)) {
    return false;
  }

  // The number of refs we ultimately need to transfer to the new root.
  uintptr_t ref_delta = 0;
  while (true) {
    upb_ArenaInternal* new_root = _upb_Arena_DoFuse(a1, a2, &ref_delta);
    if (new_root != NULL && _upb_Arena_FixupRefs(new_root, ref_delta)) {
      return true;
    }
  }
}